

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4_dash_event.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  string out_file;
  string urn;
  ingest_event_stream ingest_stream;
  ifstream input;
  allocator local_4e1;
  char *local_4e0;
  long local_4d8;
  char local_4d0 [16];
  string local_4c0;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [16];
  ingest_event_stream local_480;
  long local_230 [4];
  int aiStack_210 [122];
  
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_type_._M_dataplus._M_p =
       (pointer)&local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_type_.field_2;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_._vptr_box =
       (_func_int **)&PTR_size_0011cb68;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.size_ = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.large_size_ = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_type_._M_string_length = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_type_.field_2._M_local_buf[0] = '\0';
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_480.super_ingest_stream.init_fragment_.ftyp_box_._90_8_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_._vptr_box =
       (_func_int **)&PTR_size_0011cb68;
  local_480.super_ingest_stream.init_fragment_.moov_box_.size_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.large_size_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_type_._M_dataplus._M_p =
       (pointer)&local_480.super_ingest_stream.init_fragment_.moov_box_.box_type_.field_2;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_type_._M_string_length = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_type_.field_2._M_local_buf[0] = '\0';
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_480.super_ingest_stream.init_fragment_.moov_box_._90_8_ = 0;
  local_480.super_ingest_stream.media_fragment_.
  super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_480.super_ingest_stream.media_fragment_.
  super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_480.super_ingest_stream.media_fragment_.
  super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480.super_ingest_stream.sidx_box_._vptr_box = (_func_int **)&PTR_size_0011cb68;
  local_480.super_ingest_stream.sidx_box_.size_ = 0;
  local_480.super_ingest_stream.sidx_box_.large_size_ = 0;
  local_480.super_ingest_stream.sidx_box_.box_type_._M_dataplus._M_p =
       (pointer)&local_480.super_ingest_stream.sidx_box_.box_type_.field_2;
  local_480.super_ingest_stream.sidx_box_.box_type_._M_string_length = 0;
  local_480.super_ingest_stream.sidx_box_.box_type_.field_2._M_local_buf[0] = '\0';
  local_480.super_ingest_stream.sidx_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_480.super_ingest_stream.sidx_box_._90_8_ = 0;
  local_480.super_ingest_stream.sidx_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_480.super_ingest_stream.sidx_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_480.super_ingest_stream.sidx_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_480.super_ingest_stream.meta_box_._vptr_box = (_func_int **)&PTR_size_0011cb68;
  local_480.super_ingest_stream.meta_box_.size_ = 0;
  local_480.super_ingest_stream.meta_box_.large_size_ = 0;
  local_480.super_ingest_stream.meta_box_.box_type_._M_dataplus._M_p =
       (pointer)&local_480.super_ingest_stream.meta_box_.box_type_.field_2;
  local_480.super_ingest_stream.meta_box_.box_type_._M_string_length = 0;
  local_480.super_ingest_stream.meta_box_.box_type_.field_2._M_local_buf[0] = '\0';
  local_480.super_ingest_stream.meta_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_480.super_ingest_stream.meta_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_480.super_ingest_stream.meta_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_480.super_ingest_stream.meta_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_480.super_ingest_stream.meta_box_._90_8_ = 0;
  local_480.super_ingest_stream.mfra_box_._vptr_box = (_func_int **)&PTR_size_0011cb68;
  local_480.super_ingest_stream.mfra_box_.size_ = 0;
  local_480.super_ingest_stream.mfra_box_.large_size_ = 0;
  local_480.super_ingest_stream.mfra_box_.box_type_._M_dataplus._M_p =
       (pointer)&local_480.super_ingest_stream.mfra_box_.box_type_.field_2;
  local_480.super_ingest_stream.mfra_box_.box_type_._M_string_length = 0;
  local_480.super_ingest_stream.mfra_box_.box_type_.field_2._M_local_buf[0] = '\0';
  local_480.super_ingest_stream.mfra_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_480.super_ingest_stream.mfra_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  local_480.super_ingest_stream.mfra_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  local_480.super_ingest_stream.mfra_box_.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  local_480.super_ingest_stream.mfra_box_._90_8_ = 0;
  local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_480.events_list_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"out_mpd_event.mpd","");
  local_498 = 0;
  local_490[0] = 0;
  local_4a0 = local_490;
  if (argc < 2) {
    print_info();
  }
  else {
    std::ifstream::ifstream(local_230,argv[1],_S_bin);
    if (*(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," reading input file: ",0x15);
      std::__cxx11::string::string((string *)&local_4e0,argv[1],&local_4e1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4e0,local_4d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_4e0 != local_4d0) {
        operator_delete(local_4e0);
      }
      if (argc != 2) {
        std::__cxx11::string::string((string *)&local_4e0,argv[2],&local_4e1);
        std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_4e0);
        if (local_4e0 != local_4d0) {
          operator_delete(local_4e0);
        }
      }
      event_track::ingest_event_stream::load_from_file(&local_480,(istream *)local_230,false);
      std::ifstream::close();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," *** writing ",0xd);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4c0._M_dataplus._M_p,
                          local_4c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"***",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      event_track::ingest_event_stream::write_to_dash_event_stream(&local_480,&local_4c0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed loading input file: ",0x1b);
      std::__cxx11::string::string((string *)&local_4e0,argv[1],&local_4e1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4e0,local_4d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_4e0 != local_4d0) {
        operator_delete(local_4e0);
      }
      print_info();
    }
    std::ifstream::~ifstream(local_230);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
  ::~_Rb_tree(&local_480.events_list_._M_t);
  fmp4_stream::ingest_stream::~ingest_stream(&local_480.super_ingest_stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{

	event_track::ingest_event_stream ingest_stream;
	string out_file = "out_mpd_event.mpd";
	string urn;

	if (argc > 1)
	{

		ifstream input(argv[1], ifstream::binary);

		if (!input.good())
		{
			cout << "failed loading input file: " << string(argv[1]) << endl;
			print_info();
			return 0;
		}

		cout << " reading input file: " << string(argv[1]) << std::endl;

		if (argc > 2) 
			out_file = string(argv[2]);

		// cmfv, cmfa files containing emsg boxes 
		ingest_stream.load_from_file(input, false);
		input.close();

		// output a sparse fragmented emsg track file 
		cout << " *** writing " << out_file << "***" << endl;

		ingest_stream.write_to_dash_event_stream(out_file);

		return 0;
	}
	else
	{
		print_info();
	}

	return 0;
}